

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

String * indigox::utils::toLower(String *__return_storage_ptr__,String *s)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = tolower((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

String toLower(const String* s){
      String t = *s;
      std::transform(t.begin(), t.end(), t.begin(), ::tolower);
      return t;
    }